

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-utils.h
# Opt level: O2

_Bool plutovg_skip_string(char **begin,char *end,char *data)

{
  char cVar1;
  char *pcVar2;
  
  for (pcVar2 = *begin; cVar1 = *data, pcVar2 < end; pcVar2 = pcVar2 + 1) {
    if (cVar1 == '\0') goto LAB_00106c98;
    if (*pcVar2 != cVar1) {
      return false;
    }
    data = data + 1;
  }
  if (cVar1 != '\0') {
    return false;
  }
LAB_00106c98:
  *begin = pcVar2;
  return true;
}

Assistant:

static inline bool plutovg_skip_string(const char** begin, const char* end, const char* data)
{
    const char* it = *begin;
    while(it < end && *data && *it == *data) {
        ++data;
        ++it;
    }

    if(*data == '\0') {
        *begin = it;
        return true;
    }

    return false;
}